

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_surf_geom_face_pass(REF_GRID ref_grid)

{
  REF_NODE pRVar1;
  REF_STATUS RVar2;
  uint uVar3;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL geom_edge;
  REF_BOOL improved;
  REF_CAVITY ref_cavity;
  REF_DBL normdev;
  REF_INT nodes [27];
  REF_INT cell;
  REF_CELL tri;
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->node;
  unique0x00012000 = ref_grid->cell[3];
  if (ref_grid->surf != 0) {
    for (nodes[0x19] = 0; nodes[0x19] < stack0xffffffffffffffd8->max; nodes[0x19] = nodes[0x19] + 1)
    {
      RVar2 = ref_cell_nodes(stack0xffffffffffffffd8,nodes[0x19],(REF_INT *)&normdev);
      if ((RVar2 == 0) && (pRVar1->ref_mpi->id == pRVar1->part[normdev._0_4_])) {
        uVar3 = ref_geom_is_a(ref_grid->geom,normdev._0_4_,1,&ref_private_macro_code_rss_1);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0xaea,"ref_cavity_surf_geom_face_pass",(ulong)uVar3,"n");
          return uVar3;
        }
        if (ref_private_macro_code_rss_1 == 0) {
          uVar3 = ref_geom_tri_norm_deviation(ref_grid,(REF_INT *)&normdev,(REF_DBL *)&ref_cavity);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0xaee,"ref_cavity_surf_geom_face_pass",(ulong)uVar3,"nd");
            return uVar3;
          }
          if ((double)ref_cavity < 0.1) {
            uVar3 = ref_cavity_create((REF_CAVITY *)&geom_edge);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0xaf0,"ref_cavity_surf_geom_face_pass",(ulong)uVar3,"create");
              return uVar3;
            }
            uVar3 = ref_cavity_form_ball(_geom_edge,ref_grid,normdev._0_4_);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0xaf1,"ref_cavity_surf_geom_face_pass",(ulong)uVar3,"insert ball");
              return uVar3;
            }
            uVar3 = ref_cavity_enlarge_conforming(_geom_edge);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0xaf2,"ref_cavity_surf_geom_face_pass",(ulong)uVar3,"enlarge tri");
              return uVar3;
            }
            if (_geom_edge->state == REF_CAVITY_VISIBLE) {
              uVar3 = ref_cavity_normdev(_geom_edge,&ref_private_macro_code_rss);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0xaf4,"ref_cavity_surf_geom_face_pass",(ulong)uVar3,"normdev tri");
                return uVar3;
              }
              if ((ref_private_macro_code_rss != 0) &&
                 (uVar3 = ref_cavity_replace(_geom_edge), uVar3 != 0)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0xaf6,"ref_cavity_surf_geom_face_pass",(ulong)uVar3,"replace tri");
                return uVar3;
              }
            }
            uVar3 = ref_cavity_free(_geom_edge);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0xaf9,"ref_cavity_surf_geom_face_pass",(ulong)uVar3,"free");
              return uVar3;
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_cavity_surf_geom_face_pass(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL normdev;
  REF_CAVITY ref_cavity;
  REF_BOOL improved, geom_edge;
  if (!ref_grid_surf(ref_grid)) return REF_SUCCESS;
  each_ref_cell_valid_cell_with_nodes(tri, cell, nodes) {
    if (!ref_node_owned(ref_node, nodes[0])) {
      continue;
    }
    RSS(ref_geom_is_a(ref_grid_geom(ref_grid), nodes[0], REF_GEOM_EDGE,
                      &geom_edge),
        "n");
    if (geom_edge) {
      continue;
    }
    RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev), "nd");
    if (normdev < 0.1) {
      RSS(ref_cavity_create(&ref_cavity), "create");
      RSS(ref_cavity_form_ball(ref_cavity, ref_grid, nodes[0]), "insert ball");
      RSS(ref_cavity_enlarge_conforming(ref_cavity), "enlarge tri");
      if (REF_CAVITY_VISIBLE == ref_cavity_state(ref_cavity)) {
        RSS(ref_cavity_normdev(ref_cavity, &improved), "normdev tri");
        if (improved) {
          RSS(ref_cavity_replace(ref_cavity), "replace tri");
        }
      }
      RSS(ref_cavity_free(ref_cavity), "free");
    }
  }
  return REF_SUCCESS;
}